

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.cpp
# Opt level: O2

void __thiscall
OpenMD::MolecularRestraint::calcForce
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *struc,
          Vector3d *molCom)

{
  uint uVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  pointer pVVar4;
  Vector<double,_3U> *pVVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3d rLab;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  DynamicRectMatrix<double> wtmp;
  DynamicRectMatrix<double> vtmp;
  DynamicRectMatrix<double> Rtmp;
  Vector3d tBody;
  Mat3x3d v;
  DynamicVector<double,_std::allocator<double>_> stmp;
  Vector3d del;
  SVD<double> svd;
  Vector3d fBody;
  Vector3d txr;
  Vector3d rBody;
  Vector3d s;
  RotMat3x3d A;
  Mat3x3d w_tr;
  Quat4d quat;
  Vector<double,_3U> local_a8;
  Vector3d fLab;
  RotMat3x3d Atrans;
  
  (this->super_Restraint).pot_ = 0.0;
  for (pVVar4 = (this->forces_).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != (this->forces_).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector(&del.super_Vector<double,_3U>,(double *)&v);
    Vector3<double>::operator=(pVVar4,&del.super_Vector<double,_3U>);
  }
  uVar1 = (this->super_Restraint).restType_;
  if ((uVar1 & 1) != 0) {
    operator-((Vector<double,_3U> *)&v,&molCom->super_Vector<double,_3U>,
              &(this->refCom_).super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&del.super_Vector<double,_3U>,(Vector<double,_3U> *)&v);
    dVar8 = Vector<double,_3U>::length(&del.super_Vector<double,_3U>);
    dVar6 = (this->super_Restraint).kDisp_ * 0.5 * dVar8 * dVar8;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar6;
    if ((this->super_Restraint).printRest_ == true) {
      v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           (double)CONCAT44(v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                            [0][0]._4_4_,1);
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&v);
      pmVar2->first = dVar8;
      pmVar2->second = dVar6;
    }
    for (pVVar5 = &((this->forces_).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>;
        pVVar5 != &((this->forces_).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_Vector<double,_3U>;
        pVVar5 = pVVar5 + 1) {
      operator*((Vector<double,_3U> *)&w_tr,-(this->super_Restraint).kDisp_,
                &del.super_Vector<double,_3U>);
      operator*((Vector<double,_3U> *)&v,(Vector<double,_3U> *)&w_tr,
                (this->super_Restraint).scaleFactor_);
      Vector<double,_3U>::add(pVVar5,(Vector<double,_3U> *)&v);
    }
    uVar1 = (this->super_Restraint).restType_;
  }
  if ((uVar1 & 2) != 0) {
    dVar6 = (molCom->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar8 = (this->super_Restraint).kAbs_;
    dVar7 = dVar8 * 0.5 * dVar6 * dVar6;
    dVar8 = -dVar8 * dVar6;
    Vector<double,_3U>::Vector(&del.super_Vector<double,_3U>);
    del.super_Vector<double,_3U>.data_[0] = 0.0;
    del.super_Vector<double,_3U>.data_[1] = 0.0;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar7;
    del.super_Vector<double,_3U>.data_[2] = dVar8;
    if ((this->super_Restraint).printRest_ == true) {
      v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
           (double)CONCAT44(v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                            [0][0]._4_4_,2);
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&v);
      pmVar2->first = dVar6;
      pmVar2->second = dVar7;
    }
    for (pVVar5 = &((this->forces_).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>;
        pVVar5 != &((this->forces_).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_Vector<double,_3U>;
        pVVar5 = pVVar5 + 1) {
      operator*((Vector<double,_3U> *)&v,&del.super_Vector<double,_3U>,
                (this->super_Restraint).scaleFactor_);
      Vector<double,_3U>::add(pVVar5,(Vector<double,_3U> *)&v);
    }
    uVar1 = (this->super_Restraint).restType_;
  }
  if (3 < (int)uVar1) {
    v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&del,(double *)&v);
    Vector<double,_3U>::Vector(&tBody.super_Vector<double,_3U>,(Vector<double,_3U> *)&del);
    RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&del,0.0);
    uVar1 = 0;
    while( true ) {
      uVar3 = (ulong)uVar1;
      pVVar4 = (struc->
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(struc->
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x18) <=
          uVar3) break;
      Vector<double,_3U>::sub
                (&pVVar4[uVar3].super_Vector<double,_3U>,&molCom->super_Vector<double,_3U>);
      outProduct<double>((SquareMatrix3<double> *)&v,
                         (struc->
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar3,
                         (this->ref_).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar3);
      RectMatrix<double,_3U,_3U>::add
                ((RectMatrix<double,_3U,_3U> *)&del,(RectMatrix<double,_3U,_3U> *)&v);
      uVar1 = uVar1 + 1;
    }
    DynamicRectMatrix<double>::DynamicRectMatrix(&Rtmp,3,3,0.0);
    DynamicRectMatrix<double>::DynamicRectMatrix(&vtmp,3,3);
    std::vector<double,_std::allocator<double>_>::vector(&stmp.data_,3,(allocator_type *)&v);
    DynamicRectMatrix<double>::DynamicRectMatrix(&wtmp,3,3);
    DynamicRectMatrix<double>::setSubMatrix<OpenMD::SquareMatrix3<double>>
              (&Rtmp,0,0,(SquareMatrix3<double> *)&del);
    JAMA::SVD<double>::SVD(&svd,&Rtmp);
    JAMA::SVD<double>::getU(&svd,&vtmp);
    std::vector<double,_std::allocator<double>_>::operator=(&stmp.data_,&svd.s.data_);
    JAMA::SVD<double>::getV(&svd,&wtmp);
    SquareMatrix<double,_3>::SquareMatrix(&v.super_SquareMatrix<double,_3>);
    Vector<double,_3U>::Vector(&s.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix(&w_tr.super_SquareMatrix<double,_3>);
    DynamicRectMatrix<double>::getSubMatrix<OpenMD::SquareMatrix3<double>>(&vtmp,0,0,&v);
    DynamicVector<double,std::allocator<double>>::getSubVector<OpenMD::Vector3<double>>
              ((DynamicVector<double,std::allocator<double>> *)&stmp,0,&s);
    DynamicRectMatrix<double>::getSubMatrix<OpenMD::SquareMatrix3<double>>(&wtmp,0,0,&w_tr);
    dVar8 = SquareMatrix3<double>::determinant(&v);
    dVar6 = SquareMatrix3<double>::determinant(&w_tr);
    if (dVar6 * dVar8 < 0.0) {
      v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]._4_4_ =
           v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0]._4_4_ ^
           0x80000000;
      v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]._4_4_ =
           v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]._4_4_ ^
           0x80000000;
      v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]._4_4_ =
           v.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]._4_4_ ^
           0x80000000;
    }
    SquareMatrix3<double>::transpose(&A,&w_tr);
    operator*(&Atrans,&v,&A);
    SquareMatrix3<double>::transpose(&A,&Atrans);
    SquareMatrix3<double>::toQuaternion(&quat,&A);
    Quaternion<double>::toTwistSwing(&quat,&twistAngle,&swingX,&swingY);
    if (((this->super_Restraint).restType_ & 4) != 0) {
      dVar6 = twistAngle - (this->super_Restraint).twist0_;
      dVar8 = (this->super_Restraint).kTwist_;
      dVar7 = dVar8 * 0.5 * dVar6 * dVar6;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar7;
      operator*(&rLab.super_Vector<double,_3U>,dVar8 * dVar6,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector<double,_3U>::sub(&tBody.super_Vector<double,_3U>,&rLab.super_Vector<double,_3U>);
      if ((this->super_Restraint).printRest_ == true) {
        rLab.super_Vector<double,_3U>.data_[0]._0_4_ = 4;
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&rLab);
        pmVar2->first = twistAngle;
        pmVar2->second = dVar7;
      }
    }
    if (((this->super_Restraint).restType_ & 8) != 0) {
      dVar6 = swingX - (this->super_Restraint).swingX0_;
      dVar8 = (this->super_Restraint).kSwingX_;
      dVar7 = dVar8 * 0.5 * dVar6 * dVar6;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar7;
      operator*(&rLab.super_Vector<double,_3U>,dVar8 * dVar6,(Vector<double,_3U> *)OpenMD::V3X);
      Vector<double,_3U>::sub(&tBody.super_Vector<double,_3U>,&rLab.super_Vector<double,_3U>);
      if ((this->super_Restraint).printRest_ == true) {
        rLab.super_Vector<double,_3U>.data_[0]._0_4_ = 8;
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&rLab);
        pmVar2->first = swingX;
        pmVar2->second = dVar7;
      }
    }
    if (((this->super_Restraint).restType_ & 0x10) != 0) {
      dVar8 = swingY - (this->super_Restraint).swingY0_;
      dVar6 = (this->super_Restraint).kSwingX_ * 0.5 * dVar8 * dVar8;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar6;
      operator*(&rLab.super_Vector<double,_3U>,(this->super_Restraint).kSwingY_ * dVar8,
                (Vector<double,_3U> *)OpenMD::V3Y);
      Vector<double,_3U>::sub(&tBody.super_Vector<double,_3U>,&rLab.super_Vector<double,_3U>);
      if ((this->super_Restraint).printRest_ == true) {
        rLab.super_Vector<double,_3U>.data_[0]._0_4_ = 0x10;
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&rLab);
        pmVar2->first = swingY;
        pmVar2->second = dVar6;
      }
    }
    dVar8 = dot<double,3u>(&tBody.super_Vector<double,_3U>,&tBody.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&rLab.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&rBody.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&txr.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&fBody.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&fLab.super_Vector<double,_3U>);
    uVar1 = 0;
    while( true ) {
      uVar3 = (ulong)uVar1;
      pVVar4 = (struc->
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(struc->
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x18) <=
          uVar3) break;
      Vector<double,_3U>::operator=
                (&rLab.super_Vector<double,_3U>,&pVVar4[uVar3].super_Vector<double,_3U>);
      operator*(&local_a8,(RectMatrix<double,_3U,_3U> *)&A,&rLab.super_Vector<double,_3U>);
      Vector3<double>::operator=(&rBody,&local_a8);
      cross<double>((Vector3<double> *)&local_a8,&tBody,&rBody);
      Vector<double,_3U>::operator=(&txr.super_Vector<double,_3U>,&local_a8);
      operator*(&local_a8,&txr.super_Vector<double,_3U>,dVar8);
      Vector3<double>::operator=((Vector3<double> *)&fBody.super_Vector<double,_3U>,&local_a8);
      operator*(&local_a8,(RectMatrix<double,_3U,_3U> *)&Atrans,&fBody.super_Vector<double,_3U>);
      Vector3<double>::operator=((Vector3<double> *)&fLab.super_Vector<double,_3U>,&local_a8);
      Vector<double,_3U>::mul(&fLab.super_Vector<double,_3U>,(this->super_Restraint).scaleFactor_);
      Vector<double,_3U>::add
                (&(this->forces_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].super_Vector<double,_3U>,
                 &fLab.super_Vector<double,_3U>);
      uVar1 = uVar1 + 1;
    }
    JAMA::SVD<double>::~SVD(&svd);
    DynamicRectMatrix<double>::deallocate(&wtmp);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&stmp);
    DynamicRectMatrix<double>::deallocate(&vtmp);
    DynamicRectMatrix<double>::deallocate(&Rtmp);
  }
  return;
}

Assistant:

void MolecularRestraint::calcForce(std::vector<Vector3d> struc,
                                     Vector3d molCom) {
    assert(struc.size() == ref_.size());

    std::vector<Vector3d>::iterator it;

    // clear out initial values:
    pot_ = 0.0;
    for (it = forces_.begin(); it != forces_.end(); ++it)
      (*it) = 0.0;

    if (restType_ & rtDisplacement) {
      Vector3d del = molCom - refCom_;

      RealType r = del.length();
      RealType p = 0.5 * kDisp_ * r * r;

      pot_ += p;

      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += -kDisp_ * del * scaleFactor_;
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = molCom(2) - posZ0_;
      RealType p   = 0.5 * kAbs_ * r * r;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);

      pot_ += p;

      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += frc * scaleFactor_;
    }

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      Mat3x3d R(0.0);

      for (unsigned int n = 0; n < struc.size(); n++) {
        /*
         * First migrate the center of mass:
         */
        struc[n] -= molCom;

        /*
         * correlation matrix R:
         *   R(i,j) = sum(over n): y(n,i) * x(n,j)
         *   where x(n) and y(n) are two vector sets
         */

        R += outProduct(struc[n], ref_[n]);
      }

      // SVD class uses dynamic matrices, so we must wrap the correlation
      // matrix before calling SVD and then unwrap the results into Mat3x3d
      // and Vector3d before we use them.

      DynamicRectMatrix<RealType> Rtmp(3, 3, 0.0);
      DynamicRectMatrix<RealType> vtmp(3, 3);
      DynamicVector<RealType> stmp(3);
      DynamicRectMatrix<RealType> wtmp(3, 3);

      Rtmp.setSubMatrix(0, 0, R);

      // Heavy lifting goes here:

      JAMA::SVD<RealType> svd(Rtmp);

      svd.getU(vtmp);
      svd.getSingularValues(stmp);
      svd.getV(wtmp);

      Mat3x3d v;
      Vector3d s;
      Mat3x3d w_tr;

      vtmp.getSubMatrix(0, 0, v);
      stmp.getSubVector(0, s);
      wtmp.getSubMatrix(0, 0, w_tr);

      bool is_reflection = (v.determinant() * w_tr.determinant()) < 0.0;

      if (is_reflection) {
        v(2, 0) = -v(2, 0);
        v(2, 1) = -v(2, 1);
        v(2, 2) = -v(2, 2);
      }

      RotMat3x3d Atrans = v * w_tr.transpose();
      RotMat3x3d A      = Atrans.transpose();

      Quat4d quat = A.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType dVdtwist, dVdswingX, dVdswingY;
      RealType dTwist, dSwingX, dSwingY;
      RealType p;

      if (restType_ & rtTwist) {
        dTwist = twistAngle - twist0_;
        /// dVdtwist = kTwist_ * sin(dTwist) ;
        /// p = kTwist_ * (1.0 - cos(dTwist) ) ;
        dVdtwist = kTwist_ * dTwist;
        p        = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;
        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        dSwingX = swingX - swingX0_;
        /// dVdswingX = kSwingX_ * 2.0 * sin(2.0 * dSwingX);
        /// p = kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        dVdswingX = kSwingX_ * dSwingX;
        p         = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }
      if (restType_ & rtSwingY) {
        dSwingY = swingY - swingY0_;
        /// dVdswingY = kSwingY_ * 2.0 * sin(2.0 * dSwingY);
        /// p = kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        dVdswingY = kSwingY_ * dSwingY;
        p         = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      RealType t2 = dot(tBody, tBody);

      Vector3d rLab, rBody, txr, fBody, fLab;

      for (unsigned int i = 0; i < struc.size(); i++) {
        rLab  = struc[i];
        rBody = A * rLab;

        txr   = cross(tBody, rBody);
        fBody = txr * t2;
        fLab  = Atrans * fBody;
        fLab *= scaleFactor_;

        forces_[i] += fLab;
      }

      // test the force vectors and see if it is the right orientation
      //       std::cout << struc.size() << std::endl << std::endl;
      //       for (int i = 0; i != struc.size(); ++i){
      //         std::cout << "H\t" << struc[i].x() << "\t" << struc[i].y() <<
      //         "\t" << struc[i].z() << "\t"; std::cout << forces_[i].x() <<
      //         "\t"
      //         << forces_[i].y()
      //         << "\t" << forces_[i].z() << std::endl;
      //       }
    }
  }